

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

bool filemgr_is_fully_resident(filemgr *file)

{
  uint64_t uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if (0 < global_config.ncacheblock) {
    uVar1 = bcache_get_num_blocks(file);
    auVar3._8_4_ = (int)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    uVar2 = (file->pos).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize;
    auVar4._8_4_ = (int)(uVar2 >> 0x20);
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = 0x45300000;
    return ((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 0.9 <
           (auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  }
  return false;
}

Assistant:

bool filemgr_is_fully_resident(struct filemgr *file)
{
    bool ret = false;
    if (global_config.ncacheblock > 0) {
        //TODO: A better thing to do is to track number of document blocks
        // and only compare those with the cached document block count
        double num_cached_blocks = (double)bcache_get_num_blocks(file);
        uint64_t num_blocks = atomic_get_uint64_t(&file->pos)
                                 / file->blocksize;
        double num_fblocks = (double)num_blocks;
        if (num_cached_blocks > num_fblocks * FILEMGR_RESIDENT_THRESHOLD) {
            ret = true;
        }
    }
    return ret;
}